

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_sub_16_er_aw(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  uint res;
  uint dst;
  uint src;
  uint *r_dst;
  
  puVar4 = m68ki_cpu.dar + (m68ki_cpu.ir >> 9 & 7);
  uVar1 = OPER_AW_16();
  uVar2 = *puVar4 & 0xffff;
  uVar3 = uVar2 - uVar1;
  m68ki_cpu.n_flag = uVar3 >> 8;
  m68ki_cpu.x_flag = uVar3 >> 8;
  m68ki_cpu.v_flag = ((uVar1 ^ uVar2) & (uVar3 ^ uVar2)) >> 8;
  m68ki_cpu.not_z_flag = uVar3 & 0xffff;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  *puVar4 = *puVar4 & 0xffff0000 | m68ki_cpu.not_z_flag;
  return;
}

Assistant:

static void m68k_op_sub_16_er_aw(void)
{
	uint* r_dst = &DX;
	uint src = OPER_AW_16();
	uint dst = MASK_OUT_ABOVE_16(*r_dst);
	uint res = dst - src;

	FLAG_N = NFLAG_16(res);
	FLAG_X = FLAG_C = CFLAG_16(res);
	FLAG_V = VFLAG_SUB_16(src, dst, res);
	FLAG_Z = MASK_OUT_ABOVE_16(res);

	*r_dst = MASK_OUT_BELOW_16(*r_dst) | FLAG_Z;
}